

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O0

IntSet * __thiscall OSTEI_VRR_Algorithm_Base::GetAllInt_2p(OSTEI_VRR_Algorithm_Base *this)

{
  bool bVar1;
  _Rb_tree_const_iterator<int> in_RSI;
  _Base_ptr in_RDI;
  pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_> *it;
  const_iterator __end1;
  const_iterator __begin1;
  VRR_IntReqMap *__range1;
  IntSet *iset;
  map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *in_stack_ffffffffffffff88;
  _Rb_tree_const_iterator<int> __last;
  _Self local_30;
  _Self local_28;
  _Base_ptr *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  __last._M_node = in_RDI;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x12203f);
  local_20 = &in_RSI._M_node[0xe]._M_right;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
       ::begin(in_stack_ffffffffffffff88);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
       ::end(in_stack_ffffffffffffff88);
  while (bVar1 = std::operator!=(&local_28,&local_30), bVar1) {
    std::
    _Rb_tree_const_iterator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::operator*((_Rb_tree_const_iterator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                 *)0x12208c);
    std::set<int,_std::less<int>,_std::allocator<int>_>::begin
              ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffff88);
    std::set<int,_std::less<int>,_std::allocator<int>_>::end
              ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffff88);
    std::set<int,std::less<int>,std::allocator<int>>::insert<std::_Rb_tree_const_iterator<int>>
              ((set<int,_std::less<int>,_std::allocator<int>_> *)in_RDI,in_RSI,__last);
    std::
    _Rb_tree_const_iterator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  *)in_RDI);
  }
  return (IntSet *)__last._M_node;
}

Assistant:

IntSet OSTEI_VRR_Algorithm_Base::GetAllInt_2p(void) const
{
    IntSet iset;
    for(const auto & it : qamint_2p_)
        iset.insert(it.second.begin(), it.second.end());
    return iset;
}